

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::scrollContentsBy(QMdiArea *this,int dx,int dy)

{
  bool bVar1;
  QMdiAreaPrivate *pQVar2;
  QMdiAreaPrivate *in_RDI;
  bool wasSubWindowsTiled;
  QMdiAreaPrivate *d;
  
  pQVar2 = d_func((QMdiArea *)0x614f04);
  bVar1 = pQVar2->isSubWindowsTiled;
  pQVar2->ignoreGeometryChange = true;
  QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI);
  QWidget::isLeftToRight((QWidget *)0x614f3f);
  QWidget::scroll((QWidget *)CONCAT44(dx,dy),d._4_4_,(int)d);
  QMdiAreaPrivate::arrangeMinimizedSubWindows(in_RDI);
  pQVar2->ignoreGeometryChange = false;
  if ((bVar1 & 1U) != 0) {
    pQVar2->isSubWindowsTiled = true;
  }
  return;
}

Assistant:

void QMdiArea::scrollContentsBy(int dx, int dy)
{
    Q_D(QMdiArea);
    const bool wasSubWindowsTiled = d->isSubWindowsTiled;
    d->ignoreGeometryChange = true;
    viewport()->scroll(isLeftToRight() ? dx : -dx, dy);
    d->arrangeMinimizedSubWindows();
    d->ignoreGeometryChange = false;
    if (wasSubWindowsTiled)
        d->isSubWindowsTiled = true;
}